

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::ShaderMatrixCase::setupUniforms
          (ShaderMatrixCase *this,int programID,Vec4 *constCoords)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar3;
  code *pcVar4;
  int local_bc;
  allocator<char> local_b5;
  int local_b4;
  Array<float,_16> local_b0;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long lVar2;
  
  local_b4 = programID;
  iVar1 = (*((this->super_ShaderRenderCase).m_renderCtx)->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  local_bc = 0;
  do {
    if (1 < local_bc) {
      return;
    }
    lVar3 = 0x128;
    if (local_bc == 1) {
      lVar3 = 0x134;
    }
    if (*(int *)((long)&(this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode
                + lVar3) != 1) goto switchD_00e6f303_caseD_6;
    pcVar4 = *(code **)(lVar2 + 0xb48);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"u_in",&local_b5);
    de::toString<int>(&local_70,&local_bc);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0,
                   &local_50,&local_70);
    iVar1 = (*pcVar4)(local_b4,local_b0.m_data._0_8_);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    if (iVar1 < 0) goto switchD_00e6f303_caseD_6;
    switch(*(undefined4 *)
            ((long)&(this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode +
            lVar3 + 4)) {
    case 1:
      (**(code **)(lVar2 + 0x14e0))
                (*(undefined4 *)
                  ((long)&deqp::gles3::Functional::s_constInFloat + (long)local_bc * 4),iVar1);
      break;
    case 2:
      (**(code **)(lVar2 + 0x1528))(iVar1,1,s_constInVec2 + (long)local_bc * 8);
      break;
    case 3:
      (**(code **)(lVar2 + 0x1568))(iVar1,1,s_constInVec3 + (long)local_bc * 0xc);
      break;
    case 4:
      (**(code **)(lVar2 + 0x15a8))(iVar1,1,s_constInVec4 + (long)local_bc * 0x10);
      break;
    case 5:
      pcVar4 = *(code **)(lVar2 + 0x15e0);
      tcu::Matrix<float,_2,_2>::getColumnMajorData
                ((Matrix<float,_2,_2> *)(s_constInMat2 + (long)local_bc * 0x10));
      goto LAB_00e6f3fa;
    case 9:
      pcVar4 = *(code **)(lVar2 + 0x1610);
      tcu::Matrix<float,_3,_3>::getColumnMajorData
                ((Array<float,_9> *)&local_b0,
                 (Matrix<float,_3,_3> *)(s_constInMat3 + (long)local_bc * 0x24));
      goto LAB_00e6f3fa;
    case 0xd:
      pcVar4 = *(code **)(lVar2 + 0x1640);
      tcu::Matrix<float,_4,_4>::getColumnMajorData
                (&local_b0,(Matrix<float,_4,_4> *)(s_constInMat4 + (long)local_bc * 0x40));
LAB_00e6f3fa:
      (*pcVar4)(iVar1,1,0,&local_b0);
    }
switchD_00e6f303_caseD_6:
    local_bc = local_bc + 1;
  } while( true );
}

Assistant:

void ShaderMatrixCase::setupUniforms (int programID, const tcu::Vec4& constCoords)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	DE_UNREF(constCoords);

	for (int inNdx = 0; inNdx < 2; inNdx++)
	{
		const ShaderInput& in = inNdx > 0 ? m_in1 : m_in0;

		if (in.inputType == INPUTTYPE_UNIFORM)
		{
			int loc = gl.getUniformLocation(programID, (string("u_in") + de::toString(inNdx)).c_str());

			if (loc < 0)
				continue;

			switch (in.dataType)
			{
				case TYPE_FLOAT:		gl.uniform1f(loc, s_constInFloat[inNdx]);													break;
				case TYPE_FLOAT_VEC2:	gl.uniform2fv(loc, 1, s_constInVec2[inNdx].getPtr());										break;
				case TYPE_FLOAT_VEC3:	gl.uniform3fv(loc, 1, s_constInVec3[inNdx].getPtr());										break;
				case TYPE_FLOAT_VEC4:	gl.uniform4fv(loc, 1, s_constInVec4[inNdx].getPtr());										break;
				case TYPE_FLOAT_MAT2:	gl.uniformMatrix2fv(loc, 1, GL_FALSE, s_constInMat2[inNdx].getColumnMajorData().getPtr());	break;
				case TYPE_FLOAT_MAT3:	gl.uniformMatrix3fv(loc, 1, GL_FALSE, s_constInMat3[inNdx].getColumnMajorData().getPtr());	break;
				case TYPE_FLOAT_MAT4:	gl.uniformMatrix4fv(loc, 1, GL_FALSE, s_constInMat4[inNdx].getColumnMajorData().getPtr());	break;
				default:
					DE_ASSERT(false);
			}
		}
	}
}